

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::clearConnections(QColumnViewPrivate *this)

{
  bool bVar1;
  Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  key_iterator kVar2;
  QAbstractItemView *in_stack_00000008;
  Connection *connection;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *__range1;
  key_iterator it;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  copy;
  iterator __end1;
  iterator __begin1;
  key_iterator *in_stack_ffffffffffffff98;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  *in_stack_ffffffffffffffb8;
  QColumnViewPrivate *this_00;
  __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::disconnect((Connection *)&in_RDI[0x23].numBuckets);
  this_00 = (QColumnViewPrivate *)&in_RDI[0x23].seed;
  local_10._M_current = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (Connection *)
       std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::begin
                 ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
                  in_RDI);
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::end
            ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                        *)in_RDI,
                       (__normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffffb8 =
         (QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
          *)__gnu_cxx::
            __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
            ::operator*(&local_10);
    QObject::disconnect((Connection *)in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::operator++(&local_10);
  }
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::QHash((QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
           *)in_RDI,
          (QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
           *)in_stack_ffffffffffffff98);
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::keyBegin(in_stack_ffffffffffffffb8);
  while( true ) {
    kVar2 = QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
            ::keyEnd(in_stack_ffffffffffffffb8);
    kVar2.i.i.bucket = (size_t)kVar2.i.i.d;
    kVar2.i.i.d = in_RDI;
    bVar1 = QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
            ::key_iterator::operator!=(in_stack_ffffffffffffff98,kVar2);
    if (!bVar1) break;
    QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::key_iterator::operator*((key_iterator *)0x8618e5);
    disconnectView(this_00,in_stack_00000008);
    QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::key_iterator::operator++((key_iterator *)in_RDI);
  }
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::~QHash((QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
            *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::clearConnections()
{
#if QT_CONFIG(animation)
    QObject::disconnect(animationConnection);
#endif
    for (const QMetaObject::Connection &connection : gripConnections)
        QObject::disconnect(connection);
    const auto copy = viewConnections;  // disconnectView modifies this container
    for (auto it = copy.keyBegin(); it != copy.keyEnd(); ++it)
        disconnectView(*it);
}